

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O1

void re2::SetUnanchoredDollar(void)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> v;
  Set s;
  vector<int,_std::allocator<int>_> local_1f8;
  Set local_1d8;
  LogMessage local_190;
  
  RE2::Options::Options((Options *)&local_190,DefaultOptions);
  RE2::Set::Set(&local_1d8,(Options *)&local_190,UNANCHORED);
  local_190._0_8_ = "foo$";
  local_190._8_4_ = 4;
  iVar2 = RE2::Set::Add(&local_1d8,(StringPiece *)&local_190,(string *)0x0);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x4d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (s.Add(\"foo$\", __null)) == (0)",
               0x2c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  bVar1 = RE2::Set::Compile(&local_1d8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x4e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (s.Compile()) == (true)",0x25);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  local_190._0_8_ = "foo";
  local_190._8_4_ = 3;
  bVar1 = RE2::Set::Match(&local_1d8,(StringPiece *)&local_190,
                          (vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x50,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),
               "Check failed: (s.Match(\"foo\", __null)) == (true)",0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_190._0_8_ = "foo";
  local_190._8_4_ = 3;
  bVar1 = RE2::Set::Match(&local_1d8,(StringPiece *)&local_190,&local_1f8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x53,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (s.Match(\"foo\", &v)) == (true)",
               0x2c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  if ((long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x54,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (v.size()) == (1)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  if (*local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != 0) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x55,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (v[0]) == (0)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  RE2::Set::~Set(&local_1d8);
  return;
}

Assistant:

TEST(Set, UnanchoredDollar) {
  RE2::Set s(RE2::DefaultOptions, RE2::UNANCHORED);

  CHECK_EQ(s.Add("foo$", NULL), 0);
  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("foo", NULL), true);

  vector<int> v;
  CHECK_EQ(s.Match("foo", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);
}